

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgst07.c
# Opt level: O3

int cgst07(trans_t trans,int n,int nrhs,SuperMatrix *A,singlecomplex *b,int ldb,singlecomplex *x,
          int ldx,singlecomplex *xact,int ldxact,float *ferr,float *berr,float *reslts)

{
  float *pfVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  int *piVar5;
  ulong uVar6;
  integer iVar7;
  float *addr;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  singlecomplex *psVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  int n__1;
  integer local_16c;
  ulong local_168;
  ulong local_160;
  singlecomplex *local_158;
  long local_150;
  long local_148;
  ulong local_140;
  integer local_138 [66];
  
  uVar6 = (ulong)(uint)n;
  local_16c = 1;
  if (n < 1 || nrhs < 1) {
    reslts[0] = 0.0;
    reslts[1] = 0.0;
  }
  else {
    local_158 = b;
    fVar15 = smach("Epsilon");
    fVar16 = smach("Safe minimum");
    local_168 = uVar6;
    addr = (float *)superlu_malloc(uVar6 * 4);
    if (addr == (float *)0x0) {
      sprintf((char *)local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for rwork",0x71,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cgst07.c"
             );
      superlu_abort_and_exit((char *)local_138);
    }
    pvVar3 = A->Store;
    lVar4 = *(long *)((long)pvVar3 + 8);
    lVar9 = (long)ldx;
    local_160 = (ulong)(uint)nrhs;
    local_148 = (long)ldxact << 3;
    local_150 = lVar9 * 8;
    fVar18 = 0.0;
    uVar8 = 0;
    psVar14 = x;
    do {
      local_138[0] = (integer)local_168;
      local_140 = uVar8;
      iVar7 = icamax_(local_138,x + uVar8 * lVar9,&local_16c);
      fVar17 = ABS(x[iVar7 + (int)(uVar8 * lVar9) + -1].i) +
               ABS(x[iVar7 + (int)(uVar8 * lVar9) + -1].r);
      if (fVar17 <= fVar16) {
        fVar17 = fVar16;
      }
      uVar8 = 0;
      fVar19 = 0.0;
      do {
        fVar20 = ABS(psVar14[uVar8].i - xact[uVar8].i) + ABS(psVar14[uVar8].r - xact[uVar8].r);
        if (fVar19 <= fVar20) {
          fVar19 = fVar20;
        }
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
      if (((1.0 < fVar17) || (fVar20 = 1.0 / fVar15, fVar19 <= (1.0 / fVar16) * fVar17)) &&
         (fVar17 = (fVar19 / fVar17) / ferr[local_140], fVar20 = fVar18, fVar18 <= fVar17)) {
        fVar20 = fVar17;
      }
      fVar18 = fVar20;
      uVar8 = local_140 + 1;
      xact = (singlecomplex *)((long)&xact->r + local_148);
      psVar14 = (singlecomplex *)((long)&psVar14->r + local_150);
    } while (uVar8 != local_160);
    *reslts = fVar18;
    fVar18 = (float)((int)local_168 + 1);
    fVar16 = fVar16 * fVar18;
    uVar8 = 0;
    psVar14 = local_158;
    do {
      uVar10 = 0;
      do {
        addr[uVar10] = ABS(psVar14[uVar10].i) + ABS(psVar14[uVar10].r);
        uVar10 = uVar10 + 1;
      } while (uVar6 != uVar10);
      if (trans == NOTRANS) {
        piVar5 = *(int **)((long)pvVar3 + 0x18);
        uVar10 = 0;
        iVar11 = *piVar5;
        do {
          iVar2 = piVar5[uVar10 + 1];
          if (iVar11 < iVar2) {
            fVar17 = x[uVar8 * lVar9 + uVar10].r;
            fVar19 = x[uVar8 * lVar9 + uVar10].i;
            lVar12 = *(long *)((long)pvVar3 + 0x10);
            lVar13 = (long)iVar11;
            do {
              pfVar1 = (float *)(lVar4 + lVar13 * 8);
              iVar11 = *(int *)(lVar12 + lVar13 * 4);
              addr[iVar11] = (ABS(pfVar1[1]) + ABS(*pfVar1)) * (ABS(fVar19) + ABS(fVar17)) +
                             addr[iVar11];
              lVar13 = lVar13 + 1;
            } while (iVar2 != lVar13);
          }
          uVar10 = uVar10 + 1;
          iVar11 = iVar2;
        } while (uVar10 != uVar6);
      }
      else {
        piVar5 = *(int **)((long)pvVar3 + 0x18);
        uVar10 = 0;
        iVar11 = *piVar5;
        do {
          iVar2 = piVar5[uVar10 + 1];
          fVar17 = 0.0;
          if (iVar11 < iVar2) {
            lVar12 = (long)iVar11;
            do {
              pfVar1 = (float *)(lVar4 + lVar12 * 8);
              fVar17 = fVar17 + (ABS(pfVar1[1]) + ABS(*pfVar1)) *
                                (ABS(x[uVar8 * lVar9 +
                                       (long)*(int *)(*(long *)((long)pvVar3 + 0x10) + lVar12 * 4)].
                                     i) + ABS(x[uVar8 * lVar9 +
                                                (long)*(int *)(*(long *)((long)pvVar3 + 0x10) +
                                                              lVar12 * 4)].r));
              lVar12 = lVar12 + 1;
            } while (iVar2 != lVar12);
          }
          addr[uVar10] = fVar17 + addr[uVar10];
          uVar10 = uVar10 + 1;
          iVar11 = iVar2;
        } while (uVar10 != uVar6);
      }
      fVar17 = *addr;
      if (1 < (int)local_168) {
        uVar10 = 1;
        do {
          if (addr[uVar10] <= fVar17) {
            fVar17 = addr[uVar10];
          }
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
      }
      if (fVar17 <= fVar16) {
        fVar17 = fVar16;
      }
      fVar19 = berr[uVar8] / (fVar16 / fVar17 + fVar15 * fVar18);
      fVar17 = fVar19;
      if ((uVar8 != 0) && (fVar17 = reslts[1], reslts[1] <= fVar19)) {
        fVar17 = fVar19;
      }
      reslts[1] = fVar17;
      uVar8 = uVar8 + 1;
      psVar14 = psVar14 + ldb;
    } while (uVar8 != local_160);
    superlu_free(addr);
  }
  return 0;
}

Assistant:

int cgst07(trans_t trans, int n, int nrhs, SuperMatrix *A, singlecomplex *b,
           int ldb, singlecomplex *x, int ldx, singlecomplex *xact,
           int ldxact, float *ferr, float *berr, float *reslts)
{
    /* Table of constant values */
    int c__1 = 1;

    /* System generated locals */
    float d__1, d__2;
    float d__3, d__4;

    /* Local variables */
    float diff, axbi;
    int    imax, irow, n__1;
    int    i, j, k;
    float unfl, ovfl;
    float xnorm;
    float errbnd;
    int    notran;
    float eps, tmp;
    float *rwork;
    singlecomplex *Aval;
    NCformat *Astore;

    /* Function prototypes */
    extern int    icamax_(int *, singlecomplex *, int *);


    /* Quick exit if N = 0 or NRHS = 0. */
    if ( n <= 0 || nrhs <= 0 ) {
	reslts[0] = 0.;
	reslts[1] = 0.;
	return 0;
    }

    eps = smach("Epsilon");
    unfl = smach("Safe minimum");
    ovfl   = 1. / unfl;
    notran = (trans == NOTRANS);

    rwork  = (float *) SUPERLU_MALLOC(n*sizeof(float));
    if ( !rwork ) ABORT("SUPERLU_MALLOC fails for rwork");
    Astore = A->Store;
    Aval   = (singlecomplex *) Astore->nzval;
    
    /* Test 1:  Compute the maximum of   
       norm(X - XACT) / ( norm(X) * FERR )   
       over all the vectors X and XACT using the infinity-norm. */

    errbnd = 0.;
    for (j = 0; j < nrhs; ++j) {
	n__1 = n;
	imax = icamax_(&n__1, &x[j*ldx], &c__1);
	d__1 = (d__2 = x[imax-1 + j*ldx].r, fabs(d__2)) + 
               (d__3 = x[imax-1 + j*ldx].i, fabs(d__3));
	xnorm = SUPERLU_MAX(d__1,unfl);
	diff = 0.;
	for (i = 0; i < n; ++i) {
	    d__1 = (d__2 = x[i+j*ldx].r - xact[i+j*ldxact].r, fabs(d__2)) +
                   (d__3 = x[i+j*ldx].i - xact[i+j*ldxact].i, fabs(d__3));
	    diff = SUPERLU_MAX(diff, d__1);
	}

	if (xnorm > 1.) {
	    goto L20;
	} else if (diff <= ovfl * xnorm) {
	    goto L20;
	} else {
	    errbnd = 1. / eps;
	    goto L30;
	}

L20:
#if 0	
	if (diff / xnorm <= ferr[j]) {
	    d__1 = diff / xnorm / ferr[j];
	    errbnd = SUPERLU_MAX(errbnd,d__1);
	} else {
	    errbnd = 1. / eps;
	}
#endif
	d__1 = diff / xnorm / ferr[j];
	errbnd = SUPERLU_MAX(errbnd,d__1);
	/*printf("Ferr: %f\n", errbnd);*/
L30:
	;
    }
    reslts[0] = errbnd;

    /* Test 2: Compute the maximum of BERR / ( (n+1)*EPS + (*) ), where 
       (*) = (n+1)*UNFL / (min_i (abs(op(A))*abs(X) + abs(b))_i ) */

    for (k = 0; k < nrhs; ++k) {
	for (i = 0; i < n; ++i) 
            rwork[i] = (d__1 = b[i + k*ldb].r, fabs(d__1)) +
                       (d__2 = b[i + k*ldb].i, fabs(d__2));
	if ( notran ) {
	    for (j = 0; j < n; ++j) {
		tmp = (d__1 = x[j + k*ldx].r, fabs(d__1)) +
                      (d__2 = x[j + k*ldx].i, fabs(d__2));
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    d__1 = (d__2 = Aval[i].r, fabs(d__2)) +
                           (d__3 = Aval[i].i, fabs(d__3));
		    rwork[Astore->rowind[i]] += d__1 * tmp;
                }
	    }
	} else {
	    for (j = 0; j < n; ++j) {
		tmp = 0.;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    d__1 = (d__2 = x[irow + k*ldx].r, fabs(d__2)) +
                           (d__3 = x[irow + k*ldx].i, fabs(d__3));
                    d__2 = (d__3 = Aval[i].r, fabs(d__3)) +
                           (d__4 = Aval[i].i, fabs(d__4));
		    tmp += d__2 * d__1;
		}
		rwork[j] += tmp;
	    }
	}

	axbi = rwork[0];
	for (i = 1; i < n; ++i) axbi = SUPERLU_MIN(axbi, rwork[i]);
	
	/* Computing MAX */
	d__1 = axbi, d__2 = (n + 1) * unfl;
	tmp = berr[k] / ((n + 1) * eps + (n + 1) * unfl / SUPERLU_MAX(d__1,d__2));
	
	if (k == 0) {
	    reslts[1] = tmp;
	} else {
	    reslts[1] = SUPERLU_MAX(reslts[1],tmp);
	}
    }

    SUPERLU_FREE(rwork);
    return 0;

}